

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnV128ConstExpr(BinaryReaderIR *this,v128 value_bits)

{
  Result RVar1;
  Location *in_R8;
  v128 val;
  Expr *local_a0;
  _Head_base<0UL,_wabt::Expr_*,_false> local_98;
  Location local_90;
  Const local_70;
  
  val.v._0_8_ = value_bits.v._8_8_;
  GetLocation(&local_90,this);
  val.v._8_8_ = &local_90;
  Const::V128(&local_70,value_bits.v._0_8_,val,in_R8);
  MakeUnique<wabt::ConstExpr,wabt::Const>((wabt *)&local_a0,&local_70);
  local_98._M_head_impl = local_a0;
  local_a0 = (Expr *)0x0;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_98);
  if (local_98._M_head_impl != (Expr *)0x0) {
    (*(local_98._M_head_impl)->_vptr_Expr[1])();
  }
  if (local_a0 != (Expr *)0x0) {
    (**(code **)(*(long *)local_a0 + 8))();
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnV128ConstExpr(v128 value_bits) {
  return AppendExpr(
      MakeUnique<ConstExpr>(Const::V128(value_bits, GetLocation())));
}